

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O3

void __thiscall hiberlite::real_bean<Person>::destroy(real_bean<Person> *this)

{
  int *piVar1;
  Person *pPVar2;
  pointer pcVar3;
  bean_key local_28;
  
  if (this->forgotten == false) {
    local_28.id = (this->key).id;
    local_28.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
    local_28.con.res = (this->key).con.res;
    if (local_28.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_28.con.res)->refCount = (local_28.con.res)->refCount + 1;
    }
    Database::dbDelete<Person>(&local_28,this->obj);
    local_28.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
    if (local_28.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      piVar1 = &(local_28.con.res)->refCount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_28.con.res)->_vptr_shared_cnt_obj_pair[1])();
      }
    }
    pPVar2 = this->obj;
    if (pPVar2 != (Person *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pPVar2->bio);
      pcVar3 = (pPVar2->name)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &(pPVar2->name).field_2) {
        operator_delete(pcVar3);
      }
    }
    operator_delete(pPVar2);
    this->forgotten = true;
    this->obj = (Person *)0x0;
    (this->key).id = -1;
  }
  return;
}

Assistant:

void real_bean<C>::destroy() {
	if(forgotten)
		return;
	Database::dbDelete(key, *obj);
	delete obj;
	forgotten=true;
	obj=NULL;
	key.id=Database::NULL_ID;
}